

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

uint8_t reverse_bits_8(uint v)

{
  uint s;
  uint r;
  uint v_local;
  
  s = 7;
  r = v;
  for (v_local = v >> 1; v_local != 0; v_local = v_local >> 1) {
    r = v_local & 1 | r << 1;
    s = s - 1;
  }
  return (uint8_t)(r << ((byte)s & 0x1f));
}

Assistant:

static uint8_t reverse_bits_8(uint v)
{
	uint r = v; // r will be reversed bits of v; first get LSB of v
	uint s = 8 - 1; // extra shift needed at end

	for (v >>= 1; v; v >>= 1) {
		r <<= 1;
		r |= v & 1;
		s--;
	}

	return r <<= s; // shift when v's highest bits are zero
}